

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Node * __thiscall Parser::var_declaration(Node *__return_storage_ptr__,Parser *this)

{
  lexemtype lVar1;
  nodekind kind;
  ostream *poVar2;
  allocator local_8d;
  lexemtype type;
  string local_88;
  Node assignNode;
  
  type = (this->lexer).lexem.type;
  if (type == INTKW) {
    kind = INT_DECL;
  }
  else if (type == FLOATKW) {
    kind = FLOAT_DECL;
  }
  else if (type == CHARKW) {
    kind = CHAR_DECL;
  }
  else {
    if (type != DOUBLEKW) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Unknown type");
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(0);
    }
    kind = DOUBLE_DECL;
  }
  assignNode.value._M_dataplus._M_p = (pointer)&assignNode.value.field_2;
  assignNode._if = false;
  assignNode._else = false;
  assignNode.value._M_string_length = 0;
  assignNode.value.field_2._M_local_buf[0] = '\0';
  assignNode.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  assignNode.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  assignNode.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_88,"",&local_8d);
  Node::Node(__return_storage_ptr__,kind,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  addDeclVar(this,&type,&assignNode,__return_storage_ptr__);
  do {
    while (lVar1 = (this->lexer).lexem.type, lVar1 == COMMA) {
      addDeclVar(this,&type,&assignNode,__return_storage_ptr__);
    }
  } while (lVar1 != SEMICOLON);
  Node::~Node(&assignNode);
  return __return_storage_ptr__;
}

Assistant:

Node Parser::var_declaration() {
    nodekind kind = EMPTY;
    lexemtype type = getLexemType();
    switch (type) {
        case INTKW:
            kind = INT_DECL;
            break;
        case DOUBLEKW:
            kind = DOUBLE_DECL;
            break;
        case FLOATKW:
            kind = FLOAT_DECL;
            break;
        case CHARKW:
            kind = CHAR_DECL;
            break;
        default:
            cout << "Unknown type" << endl;
            exit(0);
    }
    Node assignNode;
    Node declNode = Node(kind);
    addDeclVar(type, assignNode, declNode);
    while (getLexemType() != SEMICOLON) {
        if (getLexemType() == COMMA) {
            addDeclVar(type, assignNode, declNode);
        }
    }
    // todo calculate expression and add it variables map as value
    if (getLexemType() != SEMICOLON) {
        cout << "\";\" expected" << endl;
        exit(0);
    }
    return declNode;
}